

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::LayerNormalizationLayerParams::SharedCtor
          (LayerNormalizationLayerParams *this)

{
  this->gamma_ = (WeightParams *)0x0;
  this->beta_ = (WeightParams *)0x0;
  this->eps_ = 0.0;
  this->_cached_size_ = 0;
  return;
}

Assistant:

void LayerNormalizationLayerParams::SharedCtor() {
  ::memset(&gamma_, 0, reinterpret_cast<char*>(&eps_) -
    reinterpret_cast<char*>(&gamma_) + sizeof(eps_));
  _cached_size_ = 0;
}